

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

FunctionPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FunctionPortSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::DataTypeSyntax*&,slang::syntax::DeclaratorSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,DataTypeSyntax **args_5,
          DeclaratorSyntax *args_6)

{
  Token direction;
  Token constKeyword;
  Token staticKeyword;
  Token varKeyword;
  FunctionPortSyntax *this_00;
  
  this_00 = (FunctionPortSyntax *)allocate(this,0xa0,8);
  constKeyword.kind = args_1->kind;
  constKeyword._2_1_ = args_1->field_0x2;
  constKeyword.numFlags.raw = (args_1->numFlags).raw;
  constKeyword.rawLen = args_1->rawLen;
  constKeyword.info = args_1->info;
  direction.kind = args_2->kind;
  direction._2_1_ = args_2->field_0x2;
  direction.numFlags.raw = (args_2->numFlags).raw;
  direction.rawLen = args_2->rawLen;
  direction.info = args_2->info;
  varKeyword.kind = args_4->kind;
  varKeyword._2_1_ = args_4->field_0x2;
  varKeyword.numFlags.raw = (args_4->numFlags).raw;
  varKeyword.rawLen = args_4->rawLen;
  varKeyword.info = args_4->info;
  staticKeyword.kind = args_3->kind;
  staticKeyword._2_1_ = args_3->field_0x2;
  staticKeyword.numFlags.raw = (args_3->numFlags).raw;
  staticKeyword.rawLen = args_3->rawLen;
  staticKeyword.info = args_3->info;
  slang::syntax::FunctionPortSyntax::FunctionPortSyntax
            (this_00,args,constKeyword,direction,staticKeyword,varKeyword,*args_5,args_6);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }